

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DeviceMemory>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  undefined8 uVar4;
  VkDeviceSize VVar5;
  VkPhysicalDeviceProperties *pVVar6;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  size_t sVar9;
  deUint64 *pdVar10;
  long *plVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_228 [16];
  pointer local_218;
  VkAllocationCallbacks *pVStack_210;
  Handle<(vk::HandleType)7> local_208;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_200;
  VkDevice local_1e0;
  DeviceInterface *local_1d8;
  Move<vk::Handle<(vk::HandleType)7>_> local_1d0;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  VVar5 = getPageTableSize((Context *)**(undefined8 **)this,(VkDeviceSize)context);
  pVVar6 = Context::getDeviceProperties((Context *)this);
  uVar1 = (pVVar6->limits).maxMemoryAllocationCount;
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  vk = Context::getDeviceInterface((Context *)this);
  device = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_208.m_internal._0_4_ = 5;
  DStack_200.m_deviceIface = (DeviceInterface *)0x0;
  DStack_200.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(DStack_200.m_allocator._4_4_,(deUint32)params.size);
  DStack_200.m_device = (VkDevice)context;
  ::vk::allocateMemory(&local_1d0,vk,device,(VkMemoryAllocateInfo *)&local_208,local_1a8);
  local_228._0_8_ = local_1d0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
  ;
  local_228._8_8_ =
       local_1d0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_218 = (pointer)local_1d0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                       m_device;
  pVStack_210 = local_1d0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_228._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)7>_> *)(local_228 + 8),
               (VkDeviceMemory)local_228._0_8_);
  }
  uVar3 = 0x4000;
  if (uVar1 < 0x4000) {
    uVar3 = uVar1;
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar7 = getSafeObjectCount((Context *)**(undefined8 **)this,sVar8 - sVar7,
                             (long)&context->m_testCtx + VVar5);
  if (uVar3 < sVar7) {
    sVar7 = (ulong)uVar3;
  }
  local_1d8 = Context::getDeviceInterface((Context *)this);
  local_1e0 = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
            *)local_228,sVar7,(allocator_type *)local_1b0);
  local_1b0 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)7>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18));
  }
  else {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar7 != 0) {
    lVar13 = 8;
    uVar14 = 0;
    do {
      pdVar10 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 5;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnAllocation = (PFN_vkAllocationFunction)context;
      local_1a8[0].pfnReallocation._0_4_ = (deUint32)params.size;
      ::vk::allocateMemory
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_208,local_1d8,local_1e0,
                 (VkMemoryAllocateInfo *)local_1b0,(VkAllocationCallbacks *)0x0);
      pdVar10[2] = (deUint64)DStack_200.m_device;
      pdVar10[3] = (deUint64)DStack_200.m_allocator;
      *pdVar10 = local_208.m_internal;
      pdVar10[1] = (deUint64)DStack_200.m_deviceIface;
      local_208.m_internal = 0;
      DStack_200.m_deviceIface = (DeviceInterface *)0x0;
      DStack_200.m_device = (VkDevice)0x0;
      DStack_200.m_allocator = (VkAllocationCallbacks *)0x0;
      plVar11 = (long *)operator_new(0x20);
      uVar4 = local_228._0_8_;
      *(undefined4 *)(plVar11 + 1) = 0;
      *(undefined4 *)((long)plVar11 + 0xc) = 0;
      *plVar11 = (long)&PTR__SharedPtrState_00d24750;
      plVar11[2] = (long)pdVar10;
      *(undefined4 *)(plVar11 + 1) = 1;
      *(undefined4 *)((long)plVar11 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)7>_> **)local_228._0_8_ + lVar13)
      ;
      if (plVar2 != plVar11) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_228._0_8_ + lVar13 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)7>_> **)
                                           local_228._0_8_ + lVar13) + 0x10))();
          }
          LOCK();
          piVar12 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)7>_> **)uVar4 +
                                     lVar13) + 0xc);
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)7>_> **)uVar4 + lVar13);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)7>_> **)uVar4 + lVar13) = 0;
          }
        }
        *(deUint64 **)(uVar4 + lVar13 + -8) = pdVar10;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)7>_> **)uVar4 + lVar13) = plVar11;
        LOCK();
        *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
        UNLOCK();
        LOCK();
        piVar12 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)7>_> **)uVar4 + lVar13)
                         + 0xc);
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      plVar2 = plVar11 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar11 + 0x10))(plVar11);
      }
      piVar12 = (int *)((long)plVar11 + 0xc);
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      if (local_208.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                  (&DStack_200,(VkDeviceMemory)local_208.m_internal);
      }
      if ((uVar14 & 0x3ff) == 0 && uVar14 != 0) {
        tcu::TestContext::touchWatchdog(*(TestContext **)this);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (sVar7 != uVar14);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                     *)local_228,(pointer)local_228._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,(ulong)((long)(TestContext **)local_1a8[0].pfnAllocation + 1))
    ;
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
             *)local_228);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}